

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tty.c
# Opt level: O2

int run_test_tty_file(void)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  char *pcVar4;
  char *pcVar5;
  int64_t eval_b_10;
  int64_t eval_b_12;
  uv_tty_t tty_wo;
  uv_tty_t tty_ro;
  uv_tty_t tty;
  uv_loop_t loop;
  
  iVar1 = uv_loop_init(&loop);
  eval_b_10 = (int64_t)iVar1;
  tty_ro.data = (void *)0x0;
  tty.data = (void *)eval_b_10;
  if ((void *)eval_b_10 != (void *)0x0) {
    pcVar5 = "0";
    pcVar4 = "uv_loop_init(&loop)";
    uVar3 = 0x14e;
    eval_b_12 = (int64_t)(void *)0x0;
    goto LAB_0019c077;
  }
  iVar1 = open64("test/fixtures/empty_file",0);
  if (iVar1 != -1) {
    tty_ro.data = (void *)0xffffffffffffffea;
    iVar2 = uv_tty_init(&loop,&tty,iVar1,1);
    eval_b_12 = (int64_t)iVar2;
    tty_wo.data = (void *)eval_b_12;
    if (tty_ro.data != (void *)eval_b_12) {
      pcVar5 = "uv_tty_init(&loop, &tty, fd, 1)";
      pcVar4 = "UV_EINVAL";
      uVar3 = 0x152;
      eval_b_10 = (int64_t)tty_ro.data;
      goto LAB_0019c077;
    }
    iVar2 = close(iVar1);
    eval_b_10 = (int64_t)iVar2;
    tty_wo.data = (void *)0x0;
    if ((void *)eval_b_10 != (void *)0x0) {
      pcVar5 = "0";
      pcVar4 = "close(fd)";
      uVar3 = 0x153;
      eval_b_12 = (int64_t)tty_wo.data;
      tty_ro.data = (void *)eval_b_10;
      goto LAB_0019c077;
    }
    tty_ro.data = (void *)0xffffffffffffffea;
    iVar1 = uv_tty_init(&loop,&tty,iVar1,1);
    tty_wo.data = (void *)(long)iVar1;
    if (tty_ro.data != tty_wo.data) {
      pcVar5 = "uv_tty_init(&loop, &tty, fd, 1)";
      pcVar4 = "UV_EINVAL";
      uVar3 = 0x155;
      eval_b_10 = (int64_t)tty_ro.data;
      eval_b_12 = (int64_t)tty_wo.data;
      goto LAB_0019c077;
    }
  }
  iVar1 = open64("/dev/random",0);
  if (iVar1 != -1) {
    tty_ro.data = (void *)0xffffffffffffffea;
    iVar2 = uv_tty_init(&loop,&tty,iVar1,1);
    tty_wo.data = (void *)(long)iVar2;
    if (tty_ro.data != tty_wo.data) {
      pcVar5 = "uv_tty_init(&loop, &tty, fd, 1)";
      pcVar4 = "UV_EINVAL";
      uVar3 = 0x15c;
      eval_b_10 = (int64_t)tty_ro.data;
      eval_b_12 = (int64_t)tty_wo.data;
      goto LAB_0019c077;
    }
    iVar1 = close(iVar1);
    eval_b_10 = (int64_t)iVar1;
    tty_wo.data = (void *)0x0;
    tty_ro.data = (void *)eval_b_10;
    if ((void *)eval_b_10 != (void *)0x0) {
      pcVar5 = "0";
      pcVar4 = "close(fd)";
      uVar3 = 0x15d;
      eval_b_12 = (int64_t)tty_wo.data;
      goto LAB_0019c077;
    }
  }
  iVar1 = open64("/dev/zero",0);
  if (iVar1 != -1) {
    tty_ro.data = (void *)0xffffffffffffffea;
    iVar2 = uv_tty_init(&loop,&tty,iVar1,1);
    tty_wo.data = (void *)(long)iVar2;
    if (tty_ro.data != tty_wo.data) {
      pcVar5 = "uv_tty_init(&loop, &tty, fd, 1)";
      pcVar4 = "UV_EINVAL";
      uVar3 = 0x163;
      eval_b_10 = (int64_t)tty_ro.data;
      eval_b_12 = (int64_t)tty_wo.data;
      goto LAB_0019c077;
    }
    iVar1 = close(iVar1);
    eval_b_10 = (int64_t)iVar1;
    tty_wo.data = (void *)0x0;
    tty_ro.data = (void *)eval_b_10;
    if ((void *)eval_b_10 != (void *)0x0) {
      pcVar5 = "0";
      pcVar4 = "close(fd)";
      uVar3 = 0x164;
      eval_b_12 = (int64_t)tty_wo.data;
      goto LAB_0019c077;
    }
  }
  iVar1 = open64("/dev/tty",2);
  if (iVar1 != -1) {
    iVar2 = uv_tty_init(&loop,&tty,iVar1,1);
    eval_b_10 = (int64_t)iVar2;
    tty_wo.data = (void *)0x0;
    tty_ro.data = (void *)eval_b_10;
    if ((void *)eval_b_10 != (void *)0x0) {
      pcVar5 = "0";
      pcVar4 = "uv_tty_init(&loop, &tty, fd, 1)";
      uVar3 = 0x169;
      eval_b_12 = (int64_t)tty_wo.data;
      goto LAB_0019c077;
    }
    iVar1 = close(iVar1);
    eval_b_10 = (int64_t)iVar1;
    tty_wo.data = (void *)0x0;
    tty_ro.data = (void *)eval_b_10;
    if ((void *)eval_b_10 != (void *)0x0) {
      pcVar5 = "0";
      pcVar4 = "close(fd)";
      uVar3 = 0x16a;
      eval_b_12 = (int64_t)tty_wo.data;
      goto LAB_0019c077;
    }
    iVar1 = uv_is_readable((uv_stream_t *)&tty);
    if (iVar1 == 0) {
      pcVar4 = "uv_is_readable((uv_stream_t*) &tty)";
      uVar3 = 0x16b;
      goto LAB_0019c146;
    }
    iVar1 = uv_is_writable((uv_stream_t *)&tty);
    if (iVar1 == 0) {
      pcVar4 = "uv_is_writable((uv_stream_t*) &tty)";
      uVar3 = 0x16c;
      goto LAB_0019c146;
    }
    uv_close((uv_handle_t *)&tty,(uv_close_cb)0x0);
    iVar1 = uv_is_readable((uv_stream_t *)&tty);
    if (iVar1 != 0) {
      pcVar4 = "!uv_is_readable((uv_stream_t*) &tty)";
      uVar3 = 0x16e;
      goto LAB_0019c146;
    }
    iVar1 = uv_is_writable((uv_stream_t *)&tty);
    if (iVar1 != 0) {
      pcVar4 = "!uv_is_writable((uv_stream_t*) &tty)";
      uVar3 = 0x16f;
      goto LAB_0019c146;
    }
  }
  iVar1 = open64("/dev/tty",0);
  if (iVar1 != -1) {
    iVar2 = uv_tty_init(&loop,&tty_ro,iVar1,1);
    tty_wo.data = (void *)(long)iVar2;
    if (tty_wo.data == (void *)0x0) {
      iVar1 = close(iVar1);
      tty_wo.data = (void *)(long)iVar1;
      if (tty_wo.data == (void *)0x0) {
        iVar1 = uv_is_readable((uv_stream_t *)&tty_ro);
        if (iVar1 == 0) {
          pcVar4 = "uv_is_readable((uv_stream_t*) &tty_ro)";
          uVar3 = 0x176;
          goto LAB_0019c146;
        }
        iVar1 = uv_is_writable((uv_stream_t *)&tty_ro);
        if (iVar1 != 0) {
          pcVar4 = "!uv_is_writable((uv_stream_t*) &tty_ro)";
          uVar3 = 0x177;
          goto LAB_0019c146;
        }
        uv_close((uv_handle_t *)&tty_ro,(uv_close_cb)0x0);
        iVar1 = uv_is_readable((uv_stream_t *)&tty_ro);
        if (iVar1 != 0) {
          pcVar4 = "!uv_is_readable((uv_stream_t*) &tty_ro)";
          uVar3 = 0x179;
          goto LAB_0019c146;
        }
        iVar1 = uv_is_writable((uv_stream_t *)&tty_ro);
        if (iVar1 != 0) {
          pcVar4 = "!uv_is_writable((uv_stream_t*) &tty_ro)";
          uVar3 = 0x17a;
          goto LAB_0019c146;
        }
        goto LAB_0019ba84;
      }
      pcVar4 = "close(fd)";
      uVar3 = 0x175;
    }
    else {
      pcVar4 = "uv_tty_init(&loop, &tty_ro, fd, 1)";
      uVar3 = 0x174;
    }
    pcVar5 = "0";
    eval_b_10 = (int64_t)tty_wo.data;
    eval_b_12 = (int64_t)(void *)0x0;
    goto LAB_0019c077;
  }
LAB_0019ba84:
  iVar1 = open64("/dev/tty",1);
  if (iVar1 != -1) {
    iVar2 = uv_tty_init(&loop,&tty_wo,iVar1,0);
    eval_b_10 = (int64_t)iVar2;
    eval_b_12 = 0;
    if ((void *)eval_b_10 != (void *)0x0) {
      pcVar5 = "0";
      pcVar4 = "uv_tty_init(&loop, &tty_wo, fd, 0)";
      uVar3 = 0x17f;
      goto LAB_0019c077;
    }
    iVar1 = close(iVar1);
    eval_b_10 = (int64_t)iVar1;
    eval_b_12 = 0;
    if ((void *)eval_b_10 != (void *)0x0) {
      pcVar5 = "0";
      pcVar4 = "close(fd)";
      uVar3 = 0x180;
      goto LAB_0019c077;
    }
    iVar1 = uv_is_readable((uv_stream_t *)&tty_wo);
    if (iVar1 != 0) {
      pcVar4 = "!uv_is_readable((uv_stream_t*) &tty_wo)";
      uVar3 = 0x181;
LAB_0019c146:
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tty.c"
              ,uVar3,pcVar4);
      abort();
    }
    iVar1 = uv_is_writable((uv_stream_t *)&tty_wo);
    if (iVar1 == 0) {
      pcVar4 = "uv_is_writable((uv_stream_t*) &tty_wo)";
      uVar3 = 0x182;
      goto LAB_0019c146;
    }
    uv_close((uv_handle_t *)&tty_wo,(uv_close_cb)0x0);
    iVar1 = uv_is_readable((uv_stream_t *)&tty_wo);
    if (iVar1 != 0) {
      pcVar4 = "!uv_is_readable((uv_stream_t*) &tty_wo)";
      uVar3 = 0x184;
      goto LAB_0019c146;
    }
    iVar1 = uv_is_writable((uv_stream_t *)&tty_wo);
    if (iVar1 != 0) {
      pcVar4 = "!uv_is_writable((uv_stream_t*) &tty_wo)";
      uVar3 = 0x185;
      goto LAB_0019c146;
    }
  }
  iVar1 = uv_run(&loop,UV_RUN_DEFAULT);
  eval_b_10 = (int64_t)iVar1;
  eval_b_12 = 0;
  if ((void *)eval_b_10 == (void *)0x0) {
    close_loop(&loop);
    eval_b_10 = 0;
    iVar1 = uv_loop_close(&loop);
    eval_b_12 = (int64_t)iVar1;
    if ((void *)eval_b_12 == (void *)0x0) {
      uv_library_shutdown();
      return 0;
    }
    pcVar5 = "uv_loop_close(&loop)";
    pcVar4 = "0";
    uVar3 = 0x18b;
  }
  else {
    pcVar5 = "0";
    pcVar4 = "uv_run(&loop, UV_RUN_DEFAULT)";
    uVar3 = 0x189;
  }
LAB_0019c077:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tty.c"
          ,uVar3,pcVar4,"==",pcVar5,eval_b_10,"==",eval_b_12);
  abort();
}

Assistant:

TEST_IMPL(tty_file) {
#ifndef _WIN32
  uv_loop_t loop;
  uv_tty_t tty;
  uv_tty_t tty_ro;
  uv_tty_t tty_wo;
  int fd;

  ASSERT_OK(uv_loop_init(&loop));

  fd = open("test/fixtures/empty_file", O_RDONLY);
  if (fd != -1) {
    ASSERT_EQ(UV_EINVAL, uv_tty_init(&loop, &tty, fd, 1));
    ASSERT_OK(close(fd));
    /* test EBADF handling */
    ASSERT_EQ(UV_EINVAL, uv_tty_init(&loop, &tty, fd, 1));
  }

/* Bug on AIX where '/dev/random' returns 1 from isatty() */
#ifndef _AIX
  fd = open("/dev/random", O_RDONLY);
  if (fd != -1) {
    ASSERT_EQ(UV_EINVAL, uv_tty_init(&loop, &tty, fd, 1));
    ASSERT_OK(close(fd));
  }
#endif /* _AIX */

  fd = open("/dev/zero", O_RDONLY);
  if (fd != -1) {
    ASSERT_EQ(UV_EINVAL, uv_tty_init(&loop, &tty, fd, 1));
    ASSERT_OK(close(fd));
  }

  fd = open("/dev/tty", O_RDWR);
  if (fd != -1) {
    ASSERT_OK(uv_tty_init(&loop, &tty, fd, 1));
    ASSERT_OK(close(fd)); /* TODO: it's indeterminate who owns fd now */
    ASSERT(uv_is_readable((uv_stream_t*) &tty));
    ASSERT(uv_is_writable((uv_stream_t*) &tty));
    uv_close((uv_handle_t*) &tty, NULL);
    ASSERT(!uv_is_readable((uv_stream_t*) &tty));
    ASSERT(!uv_is_writable((uv_stream_t*) &tty));
  }

  fd = open("/dev/tty", O_RDONLY);
  if (fd != -1) {
    ASSERT_OK(uv_tty_init(&loop, &tty_ro, fd, 1));
    ASSERT_OK(close(fd)); /* TODO: it's indeterminate who owns fd now */
    ASSERT(uv_is_readable((uv_stream_t*) &tty_ro));
    ASSERT(!uv_is_writable((uv_stream_t*) &tty_ro));
    uv_close((uv_handle_t*) &tty_ro, NULL);
    ASSERT(!uv_is_readable((uv_stream_t*) &tty_ro));
    ASSERT(!uv_is_writable((uv_stream_t*) &tty_ro));
  }

  fd = open("/dev/tty", O_WRONLY);
  if (fd != -1) {
    ASSERT_OK(uv_tty_init(&loop, &tty_wo, fd, 0));
    ASSERT_OK(close(fd)); /* TODO: it's indeterminate who owns fd now */
    ASSERT(!uv_is_readable((uv_stream_t*) &tty_wo));
    ASSERT(uv_is_writable((uv_stream_t*) &tty_wo));
    uv_close((uv_handle_t*) &tty_wo, NULL);
    ASSERT(!uv_is_readable((uv_stream_t*) &tty_wo));
    ASSERT(!uv_is_writable((uv_stream_t*) &tty_wo));
  }


  ASSERT_OK(uv_run(&loop, UV_RUN_DEFAULT));

  MAKE_VALGRIND_HAPPY(&loop);
#endif
  return 0;
}